

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdTransform2d>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdTransform2d *transform,string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Base_ptr __k;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  long *plVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  Property *pPVar9;
  int iVar10;
  byte bVar11;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined7 in_stack_fffffffffffffcc8;
  string local_330;
  long *local_310 [2];
  long local_300 [2];
  undefined1 local_2f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d8;
  string *local_2c8;
  Property *local_2c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2b8;
  string *local_2b0;
  string *local_2a8;
  string *local_2a0;
  string *local_298;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_290;
  string *local_288;
  _Base_ptr local_280;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_t._M_impl.super__Rb_tree_header._M_header;
  local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a8._0_8_ = local_1a8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_278,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_280 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar11 = p_Var8 == local_280;
  if (!(bool)bVar11) {
    local_288 = (string *)&transform->in;
    local_290 = &transform->rotation;
    local_298 = (string *)&transform->scale;
    local_2a0 = (string *)&transform->translation;
    local_2a8 = (string *)&transform->result;
    local_2b8 = &(transform->super_ShaderNode).super_UsdShadePrim.props;
    local_2c8 = err;
    local_2b0 = warn;
    do {
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,*(long *)(p_Var8 + 1),
                 (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
      local_1a8._0_8_ = local_1a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inputs:in","");
      pPVar9 = (Property *)local_1a8;
      local_2c0 = (Property *)(p_Var8 + 2);
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8,(string *)(p_Var8 + 2),(Property *)local_1a8,local_288,
                 (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                 CONCAT17(bVar11,in_stack_fffffffffffffcc8));
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      iVar10 = 0;
      if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
        iVar10 = 3;
LAB_0024d552:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (local_2f0._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1242);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          local_310[0] = local_300;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[10],std::__cxx11::string>
                    (&local_330,(fmt *)local_310,(string *)"inputs:in",
                     (char (*) [10])(local_2f0 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                              local_330._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          psVar3 = local_2c8;
          if (local_310[0] != local_300) {
            operator_delete(local_310[0],local_300[0] + 1);
          }
          if (psVar3 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar5 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)local_310,(ulong)(psVar3->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_330.field_2._M_allocated_capacity = *psVar1;
              local_330.field_2._8_8_ = plVar5[3];
              local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
            }
            else {
              local_330.field_2._M_allocated_capacity = *psVar1;
              local_330._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_330._M_string_length = plVar5[1];
            *plVar5 = (long)psVar1;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_330);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          iVar10 = 1;
          goto LAB_0024d552;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._8_8_ != &aStack_2d8) {
        operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
      }
      if (bVar2) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inputs:rotation","");
        pPVar9 = (Property *)local_1a8;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_2f0,&local_278,&local_1e8,local_2c0,(string *)local_1a8,
                   local_290);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_0024d84f:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if (local_2f0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1244);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            local_310[0] = local_300;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[16],std::__cxx11::string>
                      (&local_330,(fmt *)local_310,(string *)"inputs:rotation",
                       (char (*) [16])(local_2f0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                local_330._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            psVar3 = local_2c8;
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
            if (psVar3 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar5 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_310,(ulong)(psVar3->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330.field_2._8_8_ = plVar5[3];
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              }
              else {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_330._M_string_length = plVar5[1];
              *plVar5 = (long)psVar1;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_330);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar10 = 1;
            goto LAB_0024d84f;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ != &aStack_2d8) {
          operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_208[0] = local_1f8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_208,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inputs:scale","");
          pPVar9 = (Property *)local_1a8;
          (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                    ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208,(string *)local_2c0,(Property *)local_1a8,local_298,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                     CONCAT17(bVar11,in_stack_fffffffffffffcc8));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_208[0] != local_1f8) {
            operator_delete(local_208[0],local_1f8[0] + 1);
          }
          iVar10 = 0;
          if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
            iVar10 = 3;
LAB_0024db4c:
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if (local_2f0._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1246);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              local_310[0] = local_300;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        (&local_330,(fmt *)local_310,(string *)"inputs:scale",
                         (char (*) [13])(local_2f0 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9
                        );
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                  local_330._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              psVar3 = local_2c8;
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
              if (psVar3 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar5 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_310,(ulong)(psVar3->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_330.field_2._M_allocated_capacity = *psVar1;
                  local_330.field_2._8_8_ = plVar5[3];
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                }
                else {
                  local_330.field_2._M_allocated_capacity = *psVar1;
                  local_330._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_330._M_string_length = plVar5[1];
                *plVar5 = (long)psVar1;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_330);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
                if (local_310[0] != local_300) {
                  operator_delete(local_310[0],local_300[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar10 = 1;
              goto LAB_0024db4c;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._8_8_ != &aStack_2d8) {
            operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
          }
          if (bVar2) {
            local_228[0] = local_218;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_228,*(long *)(p_Var8 + 1),
                       (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
            local_1a8._0_8_ = local_1a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"inputs:translation","");
            pPVar9 = (Property *)local_1a8;
            (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                      ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_228,(string *)local_2c0,(Property *)local_1a8,local_2a0,
                       (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *
                       )CONCAT17(bVar11,in_stack_fffffffffffffcc8));
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (local_228[0] != local_218) {
              operator_delete(local_228[0],local_218[0] + 1);
            }
            iVar10 = 0;
            if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
              iVar10 = 3;
LAB_0024de49:
              bVar2 = false;
            }
            else {
              bVar2 = true;
              if (local_2f0._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1248);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                local_310[0] = local_300;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[19],std::__cxx11::string>
                          (&local_330,(fmt *)local_310,(string *)"inputs:translation",
                           (char (*) [19])(local_2f0 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar9);
                poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                    local_330._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
                psVar3 = local_2c8;
                if (local_310[0] != local_300) {
                  operator_delete(local_310[0],local_300[0] + 1);
                }
                if (psVar3 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar5 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)local_310,(ulong)(psVar3->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_330.field_2._M_allocated_capacity = *psVar1;
                    local_330.field_2._8_8_ = plVar5[3];
                    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  }
                  else {
                    local_330.field_2._M_allocated_capacity = *psVar1;
                    local_330._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_330._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar1;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_330);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                  if (local_310[0] != local_300) {
                    operator_delete(local_310[0],local_300[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                iVar10 = 1;
                goto LAB_0024de49;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._8_8_ != &aStack_2d8) {
              operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
            }
            if (bVar2) {
              local_248[0] = local_238;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_248,*(long *)(p_Var8 + 1),
                         (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
              local_1a8._0_8_ = local_1a8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,"outputs:result","");
              pPVar9 = (Property *)local_1a8;
              (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                        ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_248,(string *)local_2c0,(Property *)local_1a8,local_2a8,
                         (TypedTerminalAttribute<std::array<float,_2UL>_> *)
                         CONCAT17(bVar11,in_stack_fffffffffffffcc8));
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              if (local_248[0] != local_238) {
                operator_delete(local_248[0],local_238[0] + 1);
              }
              iVar10 = 0;
              if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
                iVar10 = 3;
LAB_0024e146:
                bVar2 = false;
              }
              else {
                bVar2 = true;
                if (local_2f0._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x124a);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                  local_310[0] = local_300;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_310,
                             "Parsing shader output property `{}` failed. Error: {}","");
                  fmt::format<char[15],std::__cxx11::string>
                            (&local_330,(fmt *)local_310,(string *)"outputs:result",
                             (char (*) [15])(local_2f0 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar9);
                  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                      local_330._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                  psVar3 = local_2c8;
                  if (local_310[0] != local_300) {
                    operator_delete(local_310[0],local_300[0] + 1);
                  }
                  if (psVar3 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar5 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)local_310,(ulong)(psVar3->_M_dataplus)._M_p)
                    ;
                    psVar1 = (size_type *)(plVar5 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_330.field_2._M_allocated_capacity = *psVar1;
                      local_330.field_2._8_8_ = plVar5[3];
                      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                    }
                    else {
                      local_330.field_2._M_allocated_capacity = *psVar1;
                      local_330._M_dataplus._M_p = (pointer)*plVar5;
                    }
                    local_330._M_string_length = plVar5[1];
                    *plVar5 = (long)psVar1;
                    plVar5[1] = 0;
                    *(undefined1 *)(plVar5 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_330);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p != &local_330.field_2) {
                      operator_delete(local_330._M_dataplus._M_p,
                                      local_330.field_2._M_allocated_capacity + 1);
                    }
                    if (local_310[0] != local_300) {
                      operator_delete(local_310[0],local_300[0] + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  iVar10 = 1;
                  goto LAB_0024e146;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._8_8_ != &aStack_2d8) {
                operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
              }
              if (bVar2) {
                __k = p_Var8 + 1;
                cVar6 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_278,(key_type *)__k);
                if ((_Rb_tree_header *)cVar6._M_node ==
                    &local_278._M_t._M_impl.super__Rb_tree_header) {
                  pmVar7 = ::std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           ::operator[](local_2b8,(key_type *)__k);
                  ::std::__cxx11::string::_M_assign((string *)pmVar7);
                  (pmVar7->_attrib)._varying_authored = (bool)p_Var8[3].field_0x4;
                  (pmVar7->_attrib)._variability = p_Var8[3]._M_color;
                  ::std::__cxx11::string::_M_assign((string *)&(pmVar7->_attrib)._type_name);
                  linb::any::operator=((any *)&(pmVar7->_attrib)._var,(any *)&p_Var8[4]._M_parent);
                  (pmVar7->_attrib)._var._blocked = SUB41(p_Var8[5]._M_color,0);
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=(&(pmVar7->_attrib)._var._ts._samples,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&p_Var8[5]._M_parent);
                  (pmVar7->_attrib)._var._ts._dirty = SUB41(p_Var8[6]._M_color,0);
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &(pmVar7->_attrib)._paths,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var8[6]._M_parent);
                  AttrMetas::operator=(&(pmVar7->_attrib)._metas,(AttrMetas *)(p_Var8 + 7));
                  *(_Base_ptr *)&pmVar7->_listOpQual = p_Var8[0x17]._M_parent;
                  (pmVar7->_rel).type = *(Type *)&p_Var8[0x17]._M_left;
                  Path::operator=(&(pmVar7->_rel).targetPath,(Path *)&p_Var8[0x17]._M_right);
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &(pmVar7->_rel).targetPathVector,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var8[0x1e]._M_parent);
                  (pmVar7->_rel).listOpQual = p_Var8[0x1f]._M_color;
                  AttrMetas::operator=(&(pmVar7->_rel)._metas,(AttrMetas *)&p_Var8[0x1f]._M_parent);
                  (pmVar7->_rel)._varying_authored = *(bool *)&p_Var8[0x2f]._M_left;
                  ::std::__cxx11::string::_M_assign((string *)&pmVar7->_prop_value_type_name);
                  pmVar7->_has_custom = *(bool *)&p_Var8[0x30]._M_right;
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_278,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
                }
                cVar6 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_278,(key_type *)__k);
                iVar10 = 0;
                if ((_Rb_tree_header *)cVar6._M_node ==
                    &local_278._M_t._M_impl.super__Rb_tree_header) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x124c);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2f0,"Unsupported/unimplemented property: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__k);
                  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(char *)local_2f0._0_8_,local_2f0._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
                    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
                  }
                  psVar3 = local_2b0;
                  if (local_2b0 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar5 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)&local_330,
                                                (ulong)(local_2c8->_M_dataplus)._M_p);
                    psVar1 = (size_type *)(plVar5 + 2);
                    if ((size_type *)*plVar5 == psVar1) {
                      local_2f0._16_8_ = *psVar1;
                      aStack_2d8._M_allocated_capacity = plVar5[3];
                      local_2f0._0_8_ = local_2f0 + 0x10;
                    }
                    else {
                      local_2f0._16_8_ = *psVar1;
                      local_2f0._0_8_ = (size_type *)*plVar5;
                    }
                    local_2f0._8_8_ = plVar5[1];
                    *plVar5 = (long)psVar1;
                    plVar5[1] = 0;
                    *(undefined1 *)(plVar5 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar3,(string *)local_2f0);
                    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
                      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p != &local_330.field_2) {
                      operator_delete(local_330._M_dataplus._M_p,
                                      local_330.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                }
              }
            }
          }
        }
      }
      if ((iVar10 != 3) && (iVar10 != 0)) break;
      p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      bVar11 = p_Var8 == local_280;
    } while (!(bool)bVar11);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_278,
             (_Link_type)local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(bVar11 & 1);
}

Assistant:

bool ReconstructShader<UsdTransform2d>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdTransform2d *transform,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("prop = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:in", UsdTransform2d,
                   transform->in)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:rotation", UsdTransform2d,
                   transform->rotation)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:scale", UsdTransform2d,
                   transform->scale)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:translation", UsdTransform2d,
                   transform->translation)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdTransform2d, transform->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, transform->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}